

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles2::Performance::anon_unknown_1::FunctionInliningCase::generateProgramData
          (ProgramData *__return_storage_ptr__,FunctionInliningCase *this,bool optimized)

{
  CaseShaderType CVar1;
  undefined2 *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  undefined8 uVar5;
  size_type *psVar6;
  long *plVar7;
  ulong *puVar8;
  int iVar9;
  ulong uVar10;
  string mainValueStatement;
  string maybeFuncDefs;
  string expression;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0;
  long lStack_2e8;
  int local_2dc;
  undefined4 *local_2d8;
  long local_2d0;
  undefined4 local_2c8;
  undefined1 uStack_2c4;
  undefined2 uStack_2c3;
  undefined1 auStack_2c1 [9];
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  long *local_298;
  undefined8 local_290;
  long local_288;
  undefined8 uStack_280;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  ProgramData *local_1b8;
  FunctionInliningCase *local_1b0;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  CVar1 = (this->super_ShaderOptimizationCase).m_caseShaderType;
  local_2d8 = &local_2c8;
  if (CVar1 == CASESHADERTYPE_FRAGMENT) {
    puVar2 = (undefined2 *)auStack_2c1;
    uStack_2c4 = 0x75;
    uStack_2c3 = 0x706d;
    local_2c8 = 0x6964656d;
    local_2d0 = 7;
  }
  else {
    if (CVar1 != CASESHADERTYPE_VERTEX) {
      uVar5 = std::__throw_logic_error("basic_string::_M_construct null not valid");
      if (local_300 != &local_2f0) {
        operator_delete(local_300,local_2f0 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,
                        CONCAT17(auStack_2c1[0],CONCAT25(uStack_2c3,CONCAT14(uStack_2c4,local_2c8)))
                        + 1);
      }
      _Unwind_Resume(uVar5);
    }
    puVar2 = &uStack_2c3;
    uStack_2c4 = 0x70;
    local_2c8 = 0x68676968;
    local_2d0 = 5;
  }
  *(undefined1 *)puVar2 = 0;
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"value*vec4(0.8, 0.7, 0.6, 0.9)","");
  if (optimized) {
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,0x1af8059);
    std::operator+(&local_340,"\tvalue = ",&local_258);
  }
  else {
    local_2dc = this->m_callNestingDepth;
    local_300 = &local_2f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,local_2d8,local_2d0 + (long)local_2d8);
    std::__cxx11::string::append((char *)&local_300);
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2d8);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    psVar6 = puVar3 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_340.field_2._M_allocated_capacity = *psVar6;
      local_340.field_2._8_8_ = puVar3[3];
    }
    else {
      local_340.field_2._M_allocated_capacity = *psVar6;
      local_340._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_340._M_string_length = puVar3[1];
    *puVar3 = psVar6;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_340);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_320.field_2._M_allocated_capacity = *psVar6;
      local_320.field_2._8_8_ = plVar4[3];
    }
    else {
      local_320.field_2._M_allocated_capacity = *psVar6;
      local_320._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_320._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_320,(ulong)local_258._M_dataplus._M_p);
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_198 = *plVar7;
      lStack_190 = plVar4[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar7;
      local_1a8 = (long *)*plVar4;
    }
    local_1a0 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_278.field_2._M_allocated_capacity = *psVar6;
      local_278.field_2._8_8_ = plVar4[3];
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar6;
      local_278._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_278._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_1b0 = this;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    local_1b8 = __return_storage_ptr__;
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (1 < local_2dc) {
      iVar9 = 1;
      do {
        local_1f8 = local_1e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_2d8,local_2d0 + (long)local_2d8);
        std::__cxx11::string::append((char *)&local_1f8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar9);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar10 = 0xf;
        if (local_1f8 != local_1e8) {
          uVar10 = local_1e8[0];
        }
        if (uVar10 < (ulong)(local_210 + local_1f0)) {
          uVar10 = 0xf;
          if (local_218 != local_208) {
            uVar10 = local_208[0];
          }
          if (uVar10 < (ulong)(local_210 + local_1f0)) goto LAB_0101ecaa;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_1f8);
        }
        else {
LAB_0101ecaa:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218);
        }
        local_298 = &local_288;
        plVar4 = puVar3 + 2;
        if ((long *)*puVar3 == plVar4) {
          local_288 = *plVar4;
          uStack_280 = puVar3[3];
        }
        else {
          local_288 = *plVar4;
          local_298 = (long *)*puVar3;
        }
        local_290 = puVar3[1];
        *puVar3 = plVar4;
        puVar3[1] = 0;
        *(undefined1 *)plVar4 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_298);
        local_1d8 = &local_1c8;
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_1c8 = *plVar7;
          lStack_1c0 = plVar4[3];
        }
        else {
          local_1c8 = *plVar7;
          local_1d8 = (long *)*plVar4;
        }
        local_1d0 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_2d8);
        local_2b8 = &local_2a8;
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_2a8 = *plVar7;
          lStack_2a0 = plVar4[3];
        }
        else {
          local_2a8 = *plVar7;
          local_2b8 = (long *)*plVar4;
        }
        local_2b0 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b8);
        puVar8 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar8) {
          local_2f0 = *puVar8;
          lStack_2e8 = plVar4[3];
          local_300 = &local_2f0;
        }
        else {
          local_2f0 = *puVar8;
          local_300 = (ulong *)*plVar4;
        }
        local_2f8 = plVar4[1];
        *plVar4 = (long)puVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<((ostringstream *)&local_1a8,iVar9 + -1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar10 = 0xf;
        if (local_300 != &local_2f0) {
          uVar10 = local_2f0;
        }
        if (uVar10 < (ulong)(local_230 + local_2f8)) {
          uVar10 = 0xf;
          if (local_238 != local_228) {
            uVar10 = local_228[0];
          }
          if (uVar10 < (ulong)(local_230 + local_2f8)) goto LAB_0101eeda;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_238,0,(char *)0x0,(ulong)local_300);
        }
        else {
LAB_0101eeda:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_238);
        }
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        psVar6 = puVar3 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_340.field_2._M_allocated_capacity = *psVar6;
          local_340.field_2._8_8_ = puVar3[3];
        }
        else {
          local_340.field_2._M_allocated_capacity = *psVar6;
          local_340._M_dataplus._M_p = (pointer)*puVar3;
        }
        local_340._M_string_length = puVar3[1];
        *puVar3 = psVar6;
        puVar3[1] = 0;
        *(undefined1 *)psVar6 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_320.field_2._M_allocated_capacity = *psVar6;
          local_320.field_2._8_8_ = plVar4[3];
        }
        else {
          local_320.field_2._M_allocated_capacity = *psVar6;
          local_320._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_320._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_320._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if (local_238 != local_228) {
          operator_delete(local_238,local_228[0] + 1);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8,local_2a8 + 1);
        }
        if (local_1d8 != &local_1c8) {
          operator_delete(local_1d8,local_1c8 + 1);
        }
        if (local_298 != &local_288) {
          operator_delete(local_298,local_288 + 1);
        }
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != local_2dc);
    }
    this = local_1b0;
    iVar9 = local_1b0->m_callNestingDepth;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::ostream::operator<<(&local_1a8,iVar9 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x1be7a25);
    __return_storage_ptr__ = local_1b8;
    puVar8 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar8) {
      local_2f0 = *puVar8;
      lStack_2e8 = plVar4[3];
      local_300 = &local_2f0;
    }
    else {
      local_2f0 = *puVar8;
      local_300 = (ulong *)*plVar4;
    }
    local_2f8 = plVar4[1];
    *plVar4 = (long)puVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_300);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_340.field_2._M_allocated_capacity = *psVar6;
      local_340.field_2._8_8_ = plVar4[3];
      local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    }
    else {
      local_340.field_2._M_allocated_capacity = *psVar6;
      local_340._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_340._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_340);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_320.field_2._M_allocated_capacity = *psVar6;
    local_320.field_2._8_8_ = plVar4[3];
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  }
  else {
    local_320.field_2._M_allocated_capacity = *psVar6;
    local_320._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_320._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if (!optimized) {
    if (local_300 != &local_2f0) {
      operator_delete(local_300,local_2f0 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
  }
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     &local_278,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,
                    CONCAT17(auStack_2c1[0],CONCAT25(uStack_2c3,CONCAT14(uStack_2c4,local_2c8))) + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string precision				= getShaderPrecision(m_caseShaderType);
		const string expression				= "value*vec4(0.8, 0.7, 0.6, 0.9)";
		const string maybeFuncDefs			= optimized ? "" : funcDefinitions(m_callNestingDepth, precision, expression);
		const string mainValueStatement		= (optimized ? "\tvalue = " + expression : "\tvalue = func" + toString(m_callNestingDepth-1) + "(value)") + ";\n";

		return defaultProgramData(m_caseShaderType, maybeFuncDefs, mainValueStatement);
	}